

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int add_shape_property(JSContext *ctx,JSShape **psh,JSObject *p,JSAtom atom,int prop_flags)

{
  JSRuntime *rt;
  JSAtomStruct *pJVar1;
  int iVar2;
  long lVar3;
  JSShape *sh;
  uint32_t uVar4;
  ulong uVar5;
  
  rt = ctx->rt;
  sh = *psh;
  if (sh->is_hashed == '\0') {
    uVar4 = 0;
  }
  else {
    js_shape_hash_unlink(rt,sh);
    uVar4 = ((sh->hash + atom) * -0x61c8ffff + prop_flags) * -0x61c8ffff;
  }
  if (sh->prop_size <= sh->prop_count) {
    iVar2 = resize_properties(ctx,psh,p,sh->prop_count + 1);
    if (iVar2 != 0) {
      if (sh->is_hashed == '\0') {
        return -1;
      }
      js_shape_hash_link(rt,sh);
      return -1;
    }
    sh = *psh;
  }
  if (sh->is_hashed != '\0') {
    sh->hash = uVar4;
    js_shape_hash_link(rt,sh);
  }
  lVar3 = (long)sh->prop_count;
  sh->prop_count = sh->prop_count + 1;
  if (0xd1 < (int)atom) {
    pJVar1 = ctx->rt->atom_array[atom];
    (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
  }
  *(JSAtom *)(&sh[1].header.field_0x4 + lVar3 * 8) = atom;
  (&sh[1].header.ref_count)[lVar3 * 2] =
       (&sh[1].header.ref_count)[lVar3 * 2] & 0x3ffffffU | prop_flags << 0x1a;
  sh->has_small_array_index = sh->has_small_array_index | (byte)(atom >> 0x1f);
  uVar5 = ~(ulong)(atom & sh->prop_hash_mask);
  (&sh[1].header.ref_count)[lVar3 * 2] =
       (&sh[1].header.ref_count)[lVar3 * 2] & 0xfc000000U |
       (&(sh->header).ref_count)[uVar5] & 0x3ffffffU;
  (&(sh->header).ref_count)[uVar5] = sh->prop_count;
  return 0;
}

Assistant:

static int add_shape_property(JSContext *ctx, JSShape **psh,
                              JSObject *p, JSAtom atom, int prop_flags)
{
    JSRuntime *rt = ctx->rt;
    JSShape *sh = *psh;
    JSShapeProperty *pr, *prop;
    uint32_t hash_mask, new_shape_hash = 0;
    intptr_t h;

    /* update the shape hash */
    if (sh->is_hashed) {
        js_shape_hash_unlink(rt, sh);
        new_shape_hash = shape_hash(shape_hash(sh->hash, atom), prop_flags);
    }

    if (unlikely(sh->prop_count >= sh->prop_size)) {
        if (resize_properties(ctx, psh, p, sh->prop_count + 1)) {
            /* in case of error, reinsert in the hash table.
               sh is still valid if resize_properties() failed */
            if (sh->is_hashed)
                js_shape_hash_link(rt, sh);
            return -1;
        }
        sh = *psh;
    }
    if (sh->is_hashed) {
        sh->hash = new_shape_hash;
        js_shape_hash_link(rt, sh);
    }
    /* Initialize the new shape property.
       The object property at p->prop[sh->prop_count] is uninitialized */
    prop = get_shape_prop(sh);
    pr = &prop[sh->prop_count++];
    pr->atom = JS_DupAtom(ctx, atom);
    pr->flags = prop_flags;
    sh->has_small_array_index |= __JS_AtomIsTaggedInt(atom);
    /* add in hash table */
    hash_mask = sh->prop_hash_mask;
    h = atom & hash_mask;
    pr->hash_next = prop_hash_end(sh)[-h - 1];
    prop_hash_end(sh)[-h - 1] = sh->prop_count;
    return 0;
}